

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

SVSetBase<double> * __thiscall
soplex::SVSetBase<double>::operator=(SVSetBase<double> *this,SVSetBase<double> *rhs)

{
  Nonzero<double> *pNVar1;
  Nonzero<double> *pNVar2;
  DLPSV *pDVar3;
  int iVar4;
  Item *pIVar5;
  DLPSV *item;
  
  if (this != rhs) {
    clear(this,(rhs->super_ClassArray<soplex::Nonzero<double>_>).thesize);
    if (0 < (rhs->super_ClassArray<soplex::Nonzero<double>_>).thesize) {
      ClassArray<soplex::Nonzero<double>_>::operator=
                (&this->super_ClassArray<soplex::Nonzero<double>_>,
                 &rhs->super_ClassArray<soplex::Nonzero<double>_>);
      ClassSet<soplex::SVSetBase<double>::DLPSV>::operator=(&this->set,&rhs->set);
      item = (rhs->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
      if (item != (DLPSV *)0x0) {
        pNVar1 = (this->super_ClassArray<soplex::Nonzero<double>_>).data;
        pNVar2 = (rhs->super_ClassArray<soplex::Nonzero<double>_>).data;
        do {
          iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(&rhs->set,item);
          pDVar3 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
          pIVar5 = (this->set).theitem + (this->set).thekey[iVar4].idx;
          if (pDVar3 == (DLPSV *)0x0) {
            (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first = &pIVar5->data;
          }
          else {
            pDVar3->thenext = &pIVar5->data;
            (pIVar5->data).theprev =
                 (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
          }
          (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last = &pIVar5->data;
          (pIVar5->data).super_SVectorBase<double>.m_elem =
               (Nonzero<double> *)
               ((long)pNVar1 + ((long)(item->super_SVectorBase<double>).m_elem - (long)pNVar2));
          (pIVar5->data).super_SVectorBase<double>.memused = 0;
          iVar4 = (item->super_SVectorBase<double>).memused;
          (pIVar5->data).super_SVectorBase<double>.memsize =
               (item->super_SVectorBase<double>).memsize;
          (pIVar5->data).super_SVectorBase<double>.memused = iVar4;
          if ((rhs->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last == item) {
            item = (DLPSV *)0x0;
          }
          else {
            item = item->thenext;
          }
        } while (item != (DLPSV *)0x0);
      }
    }
  }
  return this;
}

Assistant:

SVSetBase<R>& operator=(const SVSetBase<R>& rhs)
   {
      if(this != &rhs)
      {
         clear(rhs.size());

         if(rhs.size() > 0)
         {
            SVSetBaseArray::operator=(rhs);
            set = rhs.set;

            DLPSV* ps;
            DLPSV* newps;

            void* delta0 = &(*(static_cast<SVSetBaseArray*>(this)))[0];
            void* delta1 = &(*(static_cast<SVSetBaseArray*>(const_cast<SVSetBase<R>*>(&rhs))))[0];
            ptrdiff_t delta = reinterpret_cast<char*>(delta0) - reinterpret_cast<char*>(delta1);

            for(ps = rhs.list.first(); ps; ps = rhs.list.next(ps))
            {
               newps = &set[rhs.number(ps)];
               list.append(newps);
               newps->setMem(ps->max(),
                             reinterpret_cast<Nonzero<R>*>(reinterpret_cast<char*>(ps->mem()) + delta));
               newps->set_size(ps->size());
            }
         }
      }

      assert(isConsistent());

      return *this;
   }